

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

OnCallSpec<const_solitaire::piles::interfaces::StockPile_&()> * __thiscall
testing::internal::FunctionMocker<const_solitaire::piles::interfaces::StockPile_&()>::FindOnCallSpec
          (FunctionMocker<const_solitaire::piles::interfaces::StockPile_&()> *this,
          ArgumentTuple *args)

{
  OnCallSpec<const_solitaire::piles::interfaces::StockPile_&()> *pOVar1;
  bool bVar2;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar3 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      return (OnCallSpec<const_solitaire::piles::interfaces::StockPile_&()> *)0x0;
    }
    pOVar1 = (OnCallSpec<const_solitaire::piles::interfaces::StockPile_&()> *)ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    bVar2 = MatcherBase<const_std::tuple<>_&>::Matches
                      ((MatcherBase<const_std::tuple<>_&> *)(pOVar1 + 0x18),args);
  } while (!bVar2);
  return pOVar1;
}

Assistant:

const OnCallSpec<F>* FindOnCallSpec(
      const ArgumentTuple& args) const {
    for (UntypedOnCallSpecs::const_reverse_iterator it
             = untyped_on_call_specs_.rbegin();
         it != untyped_on_call_specs_.rend(); ++it) {
      const OnCallSpec<F>* spec = static_cast<const OnCallSpec<F>*>(*it);
      if (spec->Matches(args))
        return spec;
    }

    return nullptr;
  }